

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_rawgetp(lua_State *L,int idx,void *p)

{
  ushort uVar1;
  int iVar2;
  StkId pTVar3;
  GCObject *pGVar4;
  StkId pTVar5;
  int *piVar6;
  TValue *pTVar7;
  char *__assertion;
  TValue k;
  Value local_20;
  undefined2 local_18;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x315,"int lua_rawgetp(lua_State *, int, const void *)");
  }
  pTVar7 = index2addr(L,idx);
  if (pTVar7->tt_ != 0x8005) {
    __assert_fail("(((((t))->tt_) == (((5) | (1 << 15))))) && \"Lua table expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x317,"int lua_rawgetp(lua_State *, int, const void *)");
  }
  local_18 = 2;
  local_20.p = p;
  if (((Table *)(pTVar7->value_).gc)->tt == '\x05') {
    pTVar3 = L->top;
    pTVar7 = luaH_get((Table *)(pTVar7->value_).gc,(TValue *)&local_20);
    pGVar4 = (pTVar7->value_).gc;
    (pTVar3->value_).gc = pGVar4;
    uVar1 = pTVar7->tt_;
    pTVar3->tt_ = uVar1;
    if ((-1 < (short)uVar1) ||
       (((uVar1 & 0x7f) == (ushort)pGVar4->tt &&
        ((pGVar4->marked & (L->l_G->currentwhite ^ 0x18)) == 0)))) {
      pTVar5 = L->top;
      pTVar3 = pTVar5 + 1;
      L->top = pTVar3;
      if (L->ci->top < pTVar3) {
        __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x31a,"int lua_rawgetp(lua_State *, int, const void *)");
      }
      piVar6 = *(int **)&L[-1].hookmask;
      *piVar6 = *piVar6 + -1;
      if (*piVar6 == 0) {
        return pTVar5->tt_ & 0xf;
      }
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x31b,"int lua_rawgetp(lua_State *, int, const void *)");
    }
    __assertion = "0";
  }
  else {
    __assertion = "(((t)->value_).gc)->tt == 5";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x319,"int lua_rawgetp(lua_State *, int, const void *)");
}

Assistant:

LUA_API int lua_rawgetp (lua_State *L, int idx, const void *p) {
  StkId t;
  TValue k;
  lua_lock(L);
  t = index2addr(L, idx);
  api_check(L, ttisLtable(t), "Lua table expected");
  setpvalue(&k, cast(void *, p));
  setobj2s(L, L->top, luaH_get(hvalue(t), &k));
  api_incr_top(L);
  lua_unlock(L);
  return ttnov(L->top - 1);
}